

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O0

vec4 ImageCodec::decodeFLOAT_SINTPacked<short>(ImageCodec *codec,void *ptr)

{
  uint uVar1;
  int32_t iVar2;
  size_type sVar3;
  const_reference pvVar4;
  float *pfVar5;
  long in_RSI;
  long in_RDI;
  float fVar6;
  uint32_t rawValue;
  float upper;
  value_type *info;
  size_t i;
  make_unsigned_t<short> *data;
  vec4 result;
  uint32_t in_stack_ffffffffffffffac;
  uint32_t in_stack_ffffffffffffffb0;
  size_type sVar7;
  length_type i_00;
  size_type local_30;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_10;
  
  glm::vec<4,_float,_(glm::precision)0>::vec
            ((vec<4,_float,_(glm::precision)0> *)&local_10.field_0,0.0,0.0,0.0,1.0);
  local_30 = 0;
  while( true ) {
    sVar7 = local_30;
    sVar3 = std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::size
                      ((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                       (in_RDI + 0x28));
    if (sVar3 <= sVar7) break;
    pvVar4 = std::vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>::
             operator[]((vector<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_> *)
                        (in_RDI + 0x28),local_30);
    i_00 = (length_type)(sVar7 >> 0x20);
    fVar6 = (float)((1 << ((char)pvVar4->bitLength - 1U & 0x1f)) - 1);
    uVar1 = (int)(uint)*(ushort *)(in_RSI + (ulong)pvVar4->elementIndex * 2) >>
            ((byte)pvVar4->bitOffset & 0x1f) & (1 << ((byte)pvVar4->bitLength & 0x1f)) - 1U;
    iVar2 = imageio::sign_extend(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    pfVar5 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)CONCAT44(fVar6,uVar1),i_00);
    *pfVar5 = (float)iVar2 / fVar6;
    local_30 = local_30 + 1;
  }
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)local_10.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_SINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_signed_v<TYPE>);
        auto data = reinterpret_cast<const std::make_unsigned_t<TYPE>*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            const auto upper = static_cast<float>((1u << (info.bitLength - 1)) - 1u);
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = static_cast<float>(imageio::sign_extend(rawValue, info.bitLength)) / upper;
        }
        return result;
    }